

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffpbytoff(fitsfile *fptr,long gsize,long ngroups,long offset,void *buffer,int *status)

{
  LONGLONG *pLVar1;
  uint uVar2;
  int iVar3;
  FITSfile *pFVar4;
  long lVar5;
  char *pcVar6;
  void *__src;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  ulong local_70;
  long local_60;
  
  iVar3 = *status;
  if (iVar3 < 1) {
    pFVar4 = fptr->Fptr;
    if (fptr->HDUposition != pFVar4->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      pFVar4 = fptr->Fptr;
    }
    uVar2 = pFVar4->curbuf;
    if ((int)uVar2 < 0) {
      ffldrc(fptr,pFVar4->bytepos / 0xb40,0,status);
      pFVar4 = fptr->Fptr;
      uVar2 = pFVar4->curbuf;
    }
    local_70 = (ulong)uVar2;
    local_60 = pFVar4->bufrecnum[(int)uVar2];
    lVar5 = local_60 * -0xb40 + pFVar4->bytepos;
    sVar9 = 0xb40 - lVar5;
    pcVar6 = pFVar4->iobuffer + lVar5 + (int)(uVar2 * 0xb40);
    if (1 < ngroups) {
      lVar5 = ngroups + -1;
      __src = buffer;
      do {
        sVar7 = gsize;
        if ((long)sVar9 < gsize) {
          sVar7 = sVar9;
        }
        memcpy(pcVar6,__src,sVar7);
        buffer = (void *)(sVar7 + (long)__src);
        if ((long)sVar9 < gsize) {
          fptr->Fptr->dirty[(int)(uint)local_70] = 1;
          local_60 = local_60 + 1;
          ffldrc(fptr,local_60,1,status);
          local_70 = (ulong)fptr->Fptr->curbuf;
          pcVar6 = fptr->Fptr->iobuffer + local_70 * 0xb40;
          memcpy(pcVar6,buffer,gsize - sVar7);
          buffer = (void *)((long)__src + gsize);
          lVar8 = (gsize - sVar7) + offset;
          pcVar6 = pcVar6 + lVar8;
          sVar9 = 0xb40 - lVar8;
        }
        else {
          pcVar6 = pcVar6 + sVar7 + offset;
          sVar9 = sVar9 - (sVar7 + offset);
        }
        if ((long)sVar9 < 1) {
          fptr->Fptr->dirty[(int)(uint)local_70] = 1;
          local_60 = local_60 + (0xb40 - sVar9) / 0xb40;
          ffldrc(fptr,local_60,1,status);
          uVar10 = -sVar9;
          local_70 = (ulong)fptr->Fptr->curbuf;
          sVar9 = 0xb40 - uVar10 % 0xb40;
          pcVar6 = fptr->Fptr->iobuffer + uVar10 % 0xb40 + local_70 * 0xb40;
        }
        lVar5 = lVar5 + -1;
        __src = buffer;
        uVar2 = (uint)local_70;
      } while (lVar5 != 0);
    }
    local_70._0_4_ = uVar2;
    sVar7 = gsize;
    if ((long)sVar9 < gsize) {
      sVar7 = sVar9;
    }
    memcpy(pcVar6,buffer,sVar7);
    if ((long)sVar9 < gsize) {
      fptr->Fptr->dirty[(int)(uint)local_70] = 1;
      ffldrc(fptr,local_60 + 1,1,status);
      local_70._0_4_ = fptr->Fptr->curbuf;
      memcpy(fptr->Fptr->iobuffer + (long)(int)(uint)local_70 * 0xb40,(void *)((long)buffer + sVar7)
             ,gsize - sVar7);
    }
    pFVar4 = fptr->Fptr;
    pFVar4->dirty[(int)(uint)local_70] = 1;
    pLVar1 = &pFVar4->bytepos;
    *pLVar1 = *pLVar1 + (ngroups + -1) * offset + gsize * ngroups;
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffpbytoff(fitsfile *fptr, /* I - FITS file pointer                   */
           long gsize,        /* I - size of each group of bytes         */
           long ngroups,      /* I - number of groups to write           */
           long offset,       /* I - size of gap between groups          */
           void *buffer,      /* I - buffer to be written                */
           int *status)       /* IO - error status                       */
/*
  put (write) the buffer of bytes to the output FITS file, with an offset
  between each group of bytes.  This function combines ffmbyt and ffpbyt
  for increased efficiency.
*/
{
    int bcurrent;
    long ii, bufpos, nspace, nwrite, record;
    char *cptr, *ioptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    cptr = (char *)buffer;
    bcurrent = (fptr->Fptr)->curbuf;     /* number of the current IO buffer */
    record = (fptr->Fptr)->bufrecnum[bcurrent];  /* zero-indexed record number */
    bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)record * IOBUFLEN)); /* start pos */
    nspace = IOBUFLEN - bufpos;  /* amount of space left in buffer */
    ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  

    for (ii = 1; ii < ngroups; ii++)  /* write all but the last group */
    {
      /* copy bytes from user's buffer to the IO buffer */
      nwrite = minvalue(gsize, nspace);
      memcpy(ioptr, cptr, nwrite);
      cptr += nwrite;          /* increment buffer pointer */

      if (nwrite < gsize)        /* entire group did not fit */
      {
        (fptr->Fptr)->dirty[bcurrent] = TRUE;  /* mark record as having been modified */
        record++;
        ffldrc(fptr, record, IGNORE_EOF, status);  /* load next record */
        bcurrent = (fptr->Fptr)->curbuf;
        ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

        nwrite  = gsize - nwrite;
        memcpy(ioptr, cptr, nwrite);
        cptr   += nwrite;            /* increment buffer pointer */
        ioptr  += (offset + nwrite); /* increment IO buffer pointer */
        nspace = IOBUFLEN - offset - nwrite;  /* amount of space left */
      }
      else
      {
        ioptr  += (offset + nwrite);  /* increment IO bufer pointer */
        nspace -= (offset + nwrite);
      }

      if (nspace <= 0) /* beyond current record? */
      {
        (fptr->Fptr)->dirty[bcurrent] = TRUE;
        record += ((IOBUFLEN - nspace) / IOBUFLEN); /* new record number */
        ffldrc(fptr, record, IGNORE_EOF, status);
        bcurrent = (fptr->Fptr)->curbuf;

        bufpos = (-nspace) % IOBUFLEN; /* starting buffer pos */
        nspace = IOBUFLEN - bufpos;
        ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  
      }
    }
      
    /* now write the last group */
    nwrite = minvalue(gsize, nspace);
    memcpy(ioptr, cptr, nwrite);
    cptr += nwrite;          /* increment buffer pointer */

    if (nwrite < gsize)        /* entire group did not fit */
    {
      (fptr->Fptr)->dirty[bcurrent] = TRUE;  /* mark record as having been modified */
      record++;
      ffldrc(fptr, record, IGNORE_EOF, status);  /* load next record */
      bcurrent = (fptr->Fptr)->curbuf;
      ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

      nwrite  = gsize - nwrite;
      memcpy(ioptr, cptr, nwrite);
    }

    (fptr->Fptr)->dirty[bcurrent] = TRUE;    /* mark record as having been modified */
    (fptr->Fptr)->bytepos = (fptr->Fptr)->bytepos + (ngroups * gsize)
                                  + (ngroups - 1) * offset;
    return(*status);
}